

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void update_square_wave(Channel *channel,u32 total_frames)

{
  u8 uVar1;
  byte bVar2;
  uint local_24;
  u8 sample;
  u32 frames;
  SquareWave *square;
  u32 total_frames_local;
  Channel *channel_local;
  
  square._4_4_ = total_frames;
  if (channel->status != FALSE) {
    for (; square._4_4_ != 0; square._4_4_ = square._4_4_ - local_24) {
      local_24 = (channel->square_wave).ticks >> 1;
      uVar1 = (channel->square_wave).sample;
      bVar2 = (channel->envelope).volume;
      if (square._4_4_ < local_24) {
        local_24 = square._4_4_;
        (channel->square_wave).ticks = (channel->square_wave).ticks + square._4_4_ * -2;
      }
      else {
        (channel->square_wave).ticks = (channel->square_wave).period;
        (channel->square_wave).position = (u8)((ulong)((channel->square_wave).position + 1) % 8);
        (channel->square_wave).sample =
             update_square_wave::duty[(channel->square_wave).duty][(channel->square_wave).position];
      }
      channel->accumulator = (-uVar1 & bVar2) * local_24 + channel->accumulator;
    }
  }
  return;
}

Assistant:

static void update_square_wave(Channel* channel, u32 total_frames) {
  static u8 duty[WAVE_DUTY_COUNT][DUTY_CYCLE_COUNT] =
      {[WAVE_DUTY_12_5] = {0, 0, 0, 0, 0, 0, 0, 1},
       [WAVE_DUTY_25] = {1, 0, 0, 0, 0, 0, 0, 1},
       [WAVE_DUTY_50] = {1, 0, 0, 0, 0, 1, 1, 1},
       [WAVE_DUTY_75] = {0, 1, 1, 1, 1, 1, 1, 0}};
  SquareWave* square = &channel->square_wave;
  if (channel->status) {
    while (total_frames) {
      u32 frames = square->ticks / APU_TICKS;
      u8 sample = CHANNELX_SAMPLE(channel, square->sample);
      if (frames <= total_frames) {
        square->ticks = square->period;
        square->position = (square->position + 1) % DUTY_CYCLE_COUNT;
        square->sample = duty[square->duty][square->position];
      } else {
        frames = total_frames;
        square->ticks -= frames * APU_TICKS;
      }
      channel->accumulator += sample * frames;
      total_frames -= frames;
    }
  }
}